

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

bool __thiscall BackwardPass::DoTrackIntOverflow(BackwardPass *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = Func::GetSourceContextId(this->func);
  uVar3 = Func::GetLocalFunctionId(this->func);
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TrackIntUsagePhase,uVar2,uVar3);
  if (!bVar1) {
    uVar2 = Func::GetSourceContextId(this->func);
    uVar3 = Func::GetLocalFunctionId(this->func);
    bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,TrackIntOverflowPhase,uVar2,uVar3);
    if (bVar1) {
      return false;
    }
    if (this->tag != BackwardPhase) {
      return false;
    }
    if (this->currentPrePassLoop != (Loop *)0x0) {
      return false;
    }
    bVar1 = GlobOpt::DoLossyIntTypeSpec(this->globOpt);
    if (bVar1) {
      bVar1 = Func::IsJitInDebugMode(this->func);
      return !bVar1;
    }
  }
  return false;
}

Assistant:

bool
BackwardPass::DoTrackIntOverflow() const
{
    return
        !PHASE_OFF(Js::TrackIntUsagePhase, func) &&
        !PHASE_OFF(Js::TrackIntOverflowPhase, func) &&
        tag == Js::BackwardPhase &&
        !IsPrePass() &&
        globOpt->DoLossyIntTypeSpec() &&
        !func->IsJitInDebugMode();
}